

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O1

int ipc_helper_send_zero(void)

{
  int iVar1;
  undefined8 uVar2;
  void *pvVar3;
  undefined8 *extraout_RDX;
  int iVar4;
  undefined8 *__size;
  int64_t eval_b;
  int64_t eval_a;
  undefined8 uStack_38;
  code *pcStack_30;
  long local_28;
  long local_20;
  undefined1 local_18 [16];
  
  iVar4 = (int)&local_28;
  pcStack_30 = (code *)0x1aad71;
  local_18 = uv_buf_init(0,0);
  pcStack_30 = (code *)0x1aad80;
  uVar2 = uv_default_loop();
  pcStack_30 = (code *)0x1aad91;
  iVar1 = uv_pipe_init(uVar2,&channel,0);
  local_20 = (long)iVar1;
  local_28 = 0;
  if (local_20 == 0) {
    pcStack_30 = (code *)0x1aadc0;
    uv_pipe_open(&channel,0);
    local_20 = 1;
    pcStack_30 = (code *)0x1aadd1;
    iVar1 = uv_is_readable(&channel);
    local_28 = (long)iVar1;
    if (local_20 != local_28) goto LAB_001aaf30;
    local_20 = 1;
    pcStack_30 = (code *)0x1aadfb;
    iVar1 = uv_is_writable(&channel);
    local_28 = (long)iVar1;
    if (local_20 != local_28) goto LAB_001aaf3d;
    pcStack_30 = (code *)0x1aae1c;
    iVar1 = uv_is_closing(&channel);
    local_20 = (long)iVar1;
    local_28 = 0;
    if (local_20 != 0) goto LAB_001aaf4a;
    pcStack_30 = (code *)0x1aae5e;
    iVar1 = uv_write(&write_req,&channel,local_18,1,send_zero_write_cb);
    local_20 = (long)iVar1;
    local_28 = 0;
    if (local_20 != 0) goto LAB_001aaf57;
    pcStack_30 = (code *)0x1aae81;
    uVar2 = uv_default_loop();
    pcStack_30 = (code *)0x1aae8b;
    iVar1 = uv_run(uVar2,0);
    local_20 = (long)iVar1;
    local_28 = 0;
    if (local_20 != 0) goto LAB_001aaf64;
    local_20 = 1;
    local_28 = (long)send_zero_write;
    if (local_28 == 1) {
      pcStack_30 = (code *)0x1aaed1;
      uVar2 = uv_default_loop();
      pcStack_30 = (code *)0x1aaee5;
      uv_walk(uVar2,close_walk_cb,0);
      pcStack_30 = (code *)0x1aaeef;
      uv_run(uVar2,0);
      local_20 = 0;
      pcStack_30 = (code *)0x1aaefd;
      uVar2 = uv_default_loop();
      pcStack_30 = (code *)0x1aaf05;
      iVar1 = uv_loop_close(uVar2);
      local_28 = (long)iVar1;
      if (local_20 == local_28) {
        pcStack_30 = (code *)0x1aaf1b;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001aaf7e;
    }
  }
  else {
    pcStack_30 = (code *)0x1aaf30;
    ipc_helper_send_zero_cold_1();
LAB_001aaf30:
    pcStack_30 = (code *)0x1aaf3d;
    ipc_helper_send_zero_cold_2();
LAB_001aaf3d:
    pcStack_30 = (code *)0x1aaf4a;
    ipc_helper_send_zero_cold_3();
LAB_001aaf4a:
    pcStack_30 = (code *)0x1aaf57;
    ipc_helper_send_zero_cold_4();
LAB_001aaf57:
    pcStack_30 = (code *)0x1aaf64;
    ipc_helper_send_zero_cold_5();
LAB_001aaf64:
    pcStack_30 = (code *)0x1aaf71;
    ipc_helper_send_zero_cold_6();
  }
  pcStack_30 = (code *)0x1aaf7e;
  ipc_helper_send_zero_cold_7();
LAB_001aaf7e:
  pcStack_30 = send_zero_write_cb;
  ipc_helper_send_zero_cold_8();
  pcStack_30 = (code *)(long)iVar4;
  uStack_38 = 0;
  if (pcStack_30 == (code *)0x0) {
    send_zero_write = send_zero_write + 1;
    return iVar4;
  }
  __size = &uStack_38;
  send_zero_write_cb_cold_1();
  pvVar3 = malloc((size_t)__size);
  *extraout_RDX = pvVar3;
  extraout_RDX[1] = __size;
  return (int)pvVar3;
}

Assistant:

int ipc_helper_send_zero(void) {
  int r;
  uv_buf_t zero_buf;

  zero_buf = uv_buf_init(0, 0);

  r = uv_pipe_init(uv_default_loop(), &channel, 0);
  ASSERT_OK(r);

  uv_pipe_open(&channel, UV_STDIN_FD);

  ASSERT_EQ(1, uv_is_readable((uv_stream_t*) &channel));
  ASSERT_EQ(1, uv_is_writable((uv_stream_t*) &channel));
  ASSERT_OK(uv_is_closing((uv_handle_t*) &channel));

  r = uv_write(&write_req,
               (uv_stream_t*)&channel,
               &zero_buf,
               1,
               send_zero_write_cb);

  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, send_zero_write);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}